

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeDynamicLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  Tensor *this_00;
  allocator local_129;
  string local_128;
  undefined1 local_100 [32];
  Result local_e0;
  undefined1 local_b0 [4];
  int rank;
  undefined1 local_88 [40];
  Result local_60;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  iVar2 = Specification::NeuralNetworkLayer::input_size(local_20);
  if (iVar2 < 1) {
    validateInputCount((Result_conflict *)local_88,local_20,0,0);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)local_88);
    Result::~Result((Result *)local_88);
  }
  else {
    validateInputCount((Result_conflict *)(local_88 + 0x28),local_20,1,3);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_88 + 0x28));
    Result::~Result((Result *)(local_88 + 0x28));
  }
  bVar1 = Result::good((Result *)__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result_conflict *)local_b0,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)local_b0);
    Result::~Result((Result *)local_b0);
  }
  iVar2 = Specification::NeuralNetworkLayer::outputtensor_size(local_20);
  if (0 < iVar2) {
    this_00 = Specification::NeuralNetworkLayer::outputtensor(local_20,0);
    local_e0.m_message._M_storage._M_storage._4_4_ = Specification::Tensor::rank(this_00);
    layer_00 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_100,"Range",(allocator *)(local_128._M_storage._M_storage + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"output",&local_129);
    checkRank((Result_conflict *)(local_100 + 0x20),layer_00,(string *)local_100,1,1,&local_128,
              local_e0.m_message._M_storage._M_storage._4_4_);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_100 + 0x20));
    Result::~Result((Result *)(local_100 + 0x20));
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)local_100);
    std::allocator<char>::~allocator((allocator<char> *)(local_128._M_storage._M_storage + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.input_size() > 0) {
        r = validateInputCount(layer, 1, 3);
    } else {
        r = validateInputCount(layer, 0, 0);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        r =  checkRank(layer, "Range", 1, 1, "output", rank);
    }

    return r;
}